

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

LogMessage * __thiscall
absl::lts_20240722::log_internal::LogMessage::AtLocation(LogMessage *this,string_view file,int line)

{
  LogMessageData *pLVar1;
  string_view sVar2;
  
  sVar2._M_str = file._M_str;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20240722::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  *(anon_unknown_2 **)&(pLVar1->entry).full_filename_ = (anon_unknown_2 *)file._M_len;
  *(char **)((long)&(pLVar1->entry).full_filename_ + 8) = sVar2._M_str;
  sVar2._M_len = (size_t)sVar2._M_str;
  sVar2 = anon_unknown_2::Basename((anon_unknown_2 *)file._M_len,sVar2);
  (((this->data_)._M_t.
    super___uniq_ptr_impl<absl::lts_20240722::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_false>.
   _M_head_impl)->entry).base_filename_ = sVar2;
  (((this->data_)._M_t.
    super___uniq_ptr_impl<absl::lts_20240722::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20240722::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20240722::log_internal::LogMessage::LogMessageData_*,_false>.
   _M_head_impl)->entry).line_ = line;
  LogBacktraceIfNeeded(this);
  return this;
}

Assistant:

LogMessage& LogMessage::AtLocation(absl::string_view file, int line) {
  data_->entry.full_filename_ = file;
  data_->entry.base_filename_ = Basename(file);
  data_->entry.line_ = line;
  LogBacktraceIfNeeded();
  return *this;
}